

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_robarm.cpp
# Opt level: O3

void __thiscall
EnvironmentROBARM::Create2DStateSpace(EnvironmentROBARM *this,State2D ***statespace2D)

{
  uint uVar1;
  undefined1 auVar2 [16];
  State2D **ppSVar3;
  ulong uVar4;
  State2D *pSVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  uVar9 = (ulong)(this->EnvROBARMCfg).EnvWidth_c;
  uVar7 = uVar9 * 8;
  if ((long)uVar9 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  ppSVar3 = (State2D **)operator_new__(uVar7);
  *statespace2D = ppSVar3;
  if (0 < (long)uVar9) {
    uVar7 = 0;
    do {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)(this->EnvROBARMCfg).EnvHeight_c;
      uVar4 = SUB168(auVar2 * ZEXT816(0xc),0);
      if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
        uVar4 = 0xffffffffffffffff;
      }
      pSVar5 = (State2D *)operator_new__(uVar4);
      (*statespace2D)[uVar7] = pSVar5;
      if ((int)uVar9 < 1) {
        lVar6 = (long)(int)uVar9;
      }
      else {
        lVar8 = 0;
        uVar4 = 0;
        do {
          (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x22])
                    (this,(long)&(*statespace2D)[uVar7]->g + lVar8,uVar7 & 0xffff,uVar4 & 0xffff);
          uVar4 = uVar4 + 1;
          uVar1 = (this->EnvROBARMCfg).EnvWidth_c;
          uVar9 = (ulong)uVar1;
          lVar6 = (long)(int)uVar1;
          lVar8 = lVar8 + 0xc;
        } while ((long)uVar4 < lVar6);
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < lVar6);
  }
  return;
}

Assistant:

void EnvironmentROBARM::Create2DStateSpace(State2D*** statespace2D)
{
    int x, y;

    //allocate a statespace for 2D search
    *statespace2D = new State2D*[EnvROBARMCfg.EnvWidth_c];
    for (x = 0; x < EnvROBARMCfg.EnvWidth_c; x++) {
        (*statespace2D)[x] = new State2D[EnvROBARMCfg.EnvHeight_c];
        for (y = 0; y < EnvROBARMCfg.EnvWidth_c; y++) {
            InitializeState2D(&(*statespace2D)[x][y], x, y);
        }
    }
}